

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsByAutoPartitionAsync
          (BeagleCPUImpl<float,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          double *outSumLogLikelihoodByPartition)

{
  BeagleCPUImpl<float,_1,_0> **in_RSI;
  offset_in_BeagleCPUImpl<float,_1,_0>_to_subr *in_RDI;
  long in_R9;
  long in_stack_00000008;
  int i_1;
  unique_lock<std::mutex> l;
  threadData *td;
  packaged_task<void_()> threadTask;
  int i;
  mutex_type *__m;
  unique_lock<std::mutex> *this_00;
  shared_future<void> *__sf;
  packaged_task<void_()> *this_01;
  int **in_stack_fffffffffffffec0;
  _Bind<void_(beagle::cpu::BeagleCPUImpl<float,_1,_0>::*(beagle::cpu::BeagleCPUImpl<float,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
  *in_stack_fffffffffffffec8;
  packaged_task<void_()> *this_02;
  BeagleCPUImpl<float,_1,_0> **in_stack_fffffffffffffed8;
  int local_114;
  int **in_stack_ffffffffffffff00;
  int **in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  double **in_stack_ffffffffffffff18;
  int *local_d8 [2];
  undefined1 local_c8 [16];
  unique_lock<std::mutex> local_b8;
  _Head_base<1UL,_const_int_*,_false> local_a8;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<float,_1,_0>_*,_false> local_a0;
  packaged_task<void_()> local_98 [5];
  BeagleCPUImpl<float,_1,_0> *local_48 [2];
  int local_34;
  long local_30;
  mutex_type local_28;
  
  local_30 = in_R9;
  for (local_34 = 0; local_34 < (int)in_RDI[0x26]; local_34 = local_34 + 1) {
    local_a0._M_head_impl = (BeagleCPUImpl<float,_1,_0> *)0x0;
    local_a8._M_head_impl = (int *)0x251;
    local_b8._M_device = (mutex_type *)(local_30 + (long)local_34 * 4);
    local_c8._12_4_ = 1;
    local_c8._0_8_ = in_stack_00000008 + (long)local_34 * 8;
    this_01 = (packaged_task<void_()> *)local_c8;
    __sf = (shared_future<void> *)(local_c8 + 0xc);
    this_00 = &local_b8;
    __m = &local_28;
    this_02 = local_98;
    std::
    bind<void(beagle::cpu::BeagleCPUImpl<float,1,0>::*)(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*),beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*&,int_const*&,int_const*&,int_const*&,int_const*,int,double*>
              (in_RDI,in_stack_fffffffffffffed8,(int **)this_02,(int **)in_stack_fffffffffffffec8,
               in_stack_fffffffffffffec0,in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
    in_stack_fffffffffffffed8 = local_48;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<float,1,0>::*(beagle::cpu::BeagleCPUImpl<float,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              (this_02,in_stack_fffffffffffffec8);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec0 = local_d8;
    in_stack_fffffffffffffec8 =
         (_Bind<void_(beagle::cpu::BeagleCPUImpl<float,_1,_0>::*(beagle::cpu::BeagleCPUImpl<float,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
          *)&stack0xffffffffffffff18;
    std::shared_future<void>::shared_future((shared_future<void> *)this_00,(future<void> *)__m);
    std::shared_future<void>::operator=((shared_future<void> *)this_01,__sf);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x19c7bc);
    std::future<void>::~future((future<void> *)0x19c7c6);
    in_stack_ffffffffffffff00 = (int **)(in_RDI[0x27] + (long)local_34 * 0xb8);
    std::unique_lock<std::mutex>::unique_lock(this_00,__m);
    in_RSI = local_48;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            *)this_00,(value_type *)__m);
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_one();
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    std::packaged_task<void_()>::~packaged_task(this_01);
  }
  for (local_114 = 0; local_114 < (int)in_RDI[0x26]; local_114 = local_114 + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)(in_RDI[0x2d] + (long)local_114 * 0x10),in_RSI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByAutoPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        double* outSumLogLikelihoodByPartition) {

    for (int i=0; i<kNumThreads; i++) {

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      bufferIndices, categoryWeightsIndices,
                      stateFrequenciesIndices, cumulativeScaleIndices,
                      &partitionIndices[i], 1,
                      &outSumLogLikelihoodByPartition[i]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}